

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

char * fmt_symbol(adh_symbol_t symbol)

{
  ushort **ppuVar1;
  adh_symbol_t symbol_local;
  
  if (symbol == -1) {
    snprintf(fmt_symbol::str,100,"NYT");
  }
  else if (symbol == -2) {
    snprintf(fmt_symbol::str,100,anon_var_dwarf_19fe);
  }
  else {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)symbol] & 2) == 0) {
      snprintf(fmt_symbol::str,100,"\'%c\'",(ulong)(uint)(int)symbol);
    }
    else {
      snprintf(fmt_symbol::str,100,"x%02X",(ulong)(uint)(int)symbol);
    }
  }
  return fmt_symbol::str;
}

Assistant:

char * fmt_symbol(adh_symbol_t symbol) {
    static char str[MAX_SYMBOL_STR] = {0};
    if(symbol == ADH_NYT_CODE)
        snprintf(str, sizeof(str), "NYT");
    else if(symbol ==  ADH_OLD_NYT_CODE)
        snprintf(str, sizeof(str), " ° ");
    else if(iscntrl(symbol))
        snprintf(str, sizeof(str), "x%02X", symbol);
    else
        snprintf(str, sizeof(str), "'%c'", symbol);

    return str;
}